

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall icu_63::Calendar::computeJulianDay(Calendar *this)

{
  int iVar1;
  UCalendarDateFields UVar2;
  undefined4 extraout_var;
  int32_t bestStamp;
  int32_t i;
  long lVar3;
  ulong uVar4;
  
  if (1 < this->fStamp[0x14]) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      if (iVar1 < this->fStamp[lVar3]) {
        iVar1 = this->fStamp[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 9);
    lVar3 = 0;
    do {
      if (iVar1 < this->fStamp[lVar3 + 0x11]) {
        iVar1 = this->fStamp[lVar3 + 0x11];
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if (iVar1 <= this->fStamp[0x14]) {
      return this->fFields[0x14];
    }
  }
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x28])(this);
  UVar2 = resolveFields(this,(UFieldResolutionTable *)CONCAT44(extraout_var,iVar1));
  uVar4 = 5;
  if (UVar2 != UCAL_FIELD_COUNT) {
    uVar4 = (ulong)UVar2;
  }
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x25])(this,uVar4);
  return iVar1;
}

Assistant:

int32_t Calendar::computeJulianDay()
{
    // We want to see if any of the date fields is newer than the
    // JULIAN_DAY.  If not, then we use JULIAN_DAY.  If so, then we do
    // the normal resolution.  We only use JULIAN_DAY if it has been
    // set by the user.  This makes it possible for the caller to set
    // the calendar to a time and call clear(MONTH) to reset the MONTH
    // to January.  This is legacy behavior.  Without this,
    // clear(MONTH) has no effect, since the internally set JULIAN_DAY
    // is used.
    if (fStamp[UCAL_JULIAN_DAY] >= (int32_t)kMinimumUserStamp) {
        int32_t bestStamp = newestStamp(UCAL_ERA, UCAL_DAY_OF_WEEK_IN_MONTH, kUnset);
        bestStamp = newestStamp(UCAL_YEAR_WOY, UCAL_EXTENDED_YEAR, bestStamp);
        if (bestStamp <= fStamp[UCAL_JULIAN_DAY]) {
            return internalGet(UCAL_JULIAN_DAY);
        }
    }

    UCalendarDateFields bestField = resolveFields(getFieldResolutionTable());
    if (bestField == UCAL_FIELD_COUNT) {
        bestField = UCAL_DAY_OF_MONTH;
    }

    return handleComputeJulianDay(bestField);
}